

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.c
# Opt level: O0

void Tags_delete(Tags *tags)

{
  wchar_t local_14;
  wchar_t i;
  Tags *tags_local;
  
  if (tags != (Tags *)0x0) {
    if (tags->tags != (Tag *)0x0) {
      for (local_14 = L'\0'; local_14 < tags->tag_count; local_14 = local_14 + L'\x01') {
        delete_tag_content(tags->tags + local_14);
      }
      free(tags->tags);
    }
    free(tags);
  }
  return;
}

Assistant:

void Tags_delete(const Tags* tags) {
    if (!tags) {
        return;
    }
    if (tags->tags) {
        int i;
        for(i = 0; i < tags->tag_count; ++i) {
            delete_tag_content(tags->tags + i);
        }
        free((void*)tags->tags);
    }
    free((void*)tags);
}